

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void UncolorAtomicMergeSet(VmInstruction *inst)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *instruction_1;
  uint userPos;
  VmInstruction *instruction;
  uint argument;
  VmInstruction *inst_local;
  
  inst->color = 0;
  if (inst->cmd == VM_INST_PHI) {
    for (instruction._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&inst->arguments),
        instruction._4_4_ < uVar1; instruction._4_4_ = instruction._4_4_ + 2) {
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,instruction._4_4_);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if (pVVar3->color != 0) {
        UncolorAtomicMergeSet(pVVar3);
      }
    }
  }
  for (instruction_1._4_4_ = 0;
      uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
      instruction_1._4_4_ < uVar1; instruction_1._4_4_ = instruction_1._4_4_ + 1) {
    ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                        (&(inst->super_VmValue).users,instruction_1._4_4_);
    pVVar3 = getType<VmInstruction>(*ppVVar2);
    if (pVVar3->cmd == VM_INST_PHI) {
      UncolorAtomicMergeSet(pVVar3);
    }
  }
  return;
}

Assistant:

void UncolorAtomicMergeSet(VmInstruction *inst)
{
	inst->color = 0;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			if(instruction->color != 0)
				UncolorAtomicMergeSet(instruction);
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			UncolorAtomicMergeSet(instruction);
	}
}